

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O1

Box<Imath_2_5::Vec3<float>_> *
Imath_2_5::affineTransform<float,float>(Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  undefined1 auVar1 [16];
  undefined4 in_ECX;
  int i;
  int iVar2;
  long lVar3;
  Box<Imath_2_5::Vec3<float>_> *newBox;
  Box<Imath_2_5::Vec3<float>_> *in_RDI;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar6 = (box->min).x;
  fVar7 = (box->max).x;
  if ((((fVar6 <= fVar7) &&
       (fVar8 = (box->min).y, pfVar4 = &(box->max).y, fVar8 < *pfVar4 || fVar8 == *pfVar4)) &&
      (fVar8 = (box->min).z, pfVar4 = &(box->max).z, fVar8 < *pfVar4 || fVar8 == *pfVar4)) &&
     (((fVar6 != -3.4028235e+38 || (NAN(fVar6))) ||
      ((auVar1._4_4_ = -(uint)((box->min).z != -3.4028235e+38),
       auVar1._0_4_ = -(uint)((box->min).y != -3.4028235e+38),
       auVar1._8_4_ = -(uint)(fVar7 != 3.4028235e+38),
       auVar1._12_4_ = -(uint)((box->max).y != 3.4028235e+38), iVar2 = movmskps(in_ECX,auVar1),
       iVar2 != 0 || ((fVar8 = (box->max).z, fVar8 != 3.4028235e+38 || (NAN(fVar8))))))))) {
    (in_RDI->min).x = 3.4028235e+38;
    (in_RDI->min).y = 3.4028235e+38;
    *(undefined8 *)&(in_RDI->min).z = 0xff7fffff7f7fffff;
    (in_RDI->max).y = -3.4028235e+38;
    (in_RDI->max).z = -3.4028235e+38;
    lVar3 = 0;
    pfVar4 = (float *)m;
    do {
      fVar6 = m->x[3][lVar3];
      (&(in_RDI->max).x)[lVar3] = fVar6;
      (&(in_RDI->min).x)[lVar3] = fVar6;
      lVar5 = 0;
      fVar7 = fVar6;
      do {
        fVar9 = *(float *)((long)&(box->min).x + lVar5) * pfVar4[lVar5];
        fVar8 = pfVar4[lVar5] * *(float *)((long)&(box->max).x + lVar5);
        fVar10 = fVar9;
        if (fVar8 <= fVar9) {
          fVar10 = fVar8;
        }
        fVar6 = fVar6 + fVar10;
        if (fVar8 <= fVar9) {
          fVar8 = fVar9;
        }
        fVar7 = fVar7 + fVar8;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      (&(in_RDI->min).x)[lVar3] = fVar6;
      (&(in_RDI->max).x)[lVar3] = fVar7;
      lVar3 = lVar3 + 1;
      pfVar4 = pfVar4 + 1;
    } while (lVar3 != 3);
    return in_RDI;
  }
  (in_RDI->min).x = fVar6;
  fVar6 = (box->min).z;
  (in_RDI->min).y = (box->min).y;
  (in_RDI->min).z = fVar6;
  (in_RDI->max).x = fVar7;
  fVar6 = (box->max).z;
  (in_RDI->max).y = (box->max).y;
  (in_RDI->max).z = fVar6;
  return in_RDI;
}

Assistant:

Box< Vec3<S> >
affineTransform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix whose rightmost column
    // is (0 0 0 1), and compute a new box that tightly encloses
    // the transformed box.
    //
    // As in the transform() function, above, we use James Arvo's
    // fast method.
    //

    if (box.isEmpty() || box.isInfinite())
    {
	//
	// A transformed empty or infinite box is still empty or infinite
	//

	return box;
    }

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 3; i++) 
    {
	newBox.min[i] = newBox.max[i] = (S) m[3][i];

	for (int j = 0; j < 3; j++) 
	{
	    S a, b;

	    a = (S) m[j][i] * box.min[j];
	    b = (S) m[j][i] * box.max[j];

	    if (a < b) 
	    {
		newBox.min[i] += a;
		newBox.max[i] += b;
	    }
	    else 
	    {
		newBox.min[i] += b;
		newBox.max[i] += a;
	    }
	}
    }

    return newBox;
}